

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O3

Future<int> * __thiscall
Omega_h::Mesh::isync_array<int>
          (Future<int> *__return_storage_ptr__,Mesh *this,Int ent_dim,Read<int> *a,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  bool bVar3;
  Read<int> local_170;
  Read<int> local_160;
  Dist local_150;
  Dist local_c0;
  
  bVar3 = could_be_shared(this,ent_dim);
  if (bVar3) {
    ask_dist(&local_c0,this,ent_dim);
    Dist::invert(&local_150,&local_c0);
    local_170.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_170.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_170.write_.shared_alloc_.alloc =
             (Alloc *)((local_170.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_170.write_.shared_alloc_.alloc)->use_count =
             (local_170.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_170.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    Dist::iexch<int>(__return_storage_ptr__,&local_150,&local_170,width);
    pAVar2 = local_170.write_.shared_alloc_.alloc;
    if (((ulong)local_170.write_.shared_alloc_.alloc & 7) == 0 &&
        local_170.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_170.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_170.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    Dist::~Dist(&local_150);
    Dist::~Dist(&local_c0);
  }
  else {
    local_160.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
        local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_160.write_.shared_alloc_.alloc =
             (Alloc *)((local_160.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_160.write_.shared_alloc_.alloc)->use_count =
             (local_160.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_160.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    Future<int>::Future(__return_storage_ptr__,&local_160);
    pAVar2 = local_160.write_.shared_alloc_.alloc;
    if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
        local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_160.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Future<T> Mesh::isync_array(Int ent_dim, Read<T> a, Int width) {
  if (!could_be_shared(ent_dim)) {
    return Future<T>(a);
  }
  return ask_dist(ent_dim).invert().iexch(a, width);
}